

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UpdateSBT
          (DeviceContextVkImpl *this,IShaderBindingTable *pSBT,
          UpdateIndirectRTBufferAttribs *pUpdateIndirectBufferAttribs)

{
  bool bVar1;
  ShaderBindingTableVkImpl *this_00;
  Char *Message;
  undefined1 local_b8 [8];
  string msg;
  char *OpName;
  BindingTable CallableShaderTable;
  BindingTable HitGroupTable;
  BindingTable MissShaderTable;
  BindingTable RayGenShaderRecord;
  BufferVkImpl *pSBTBufferVk;
  ShaderBindingTableVkImpl *pSBTVk;
  UpdateIndirectRTBufferAttribs *pUpdateIndirectBufferAttribs_local;
  IShaderBindingTable *pSBT_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateSBT
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSBT,
             pUpdateIndirectBufferAttribs,0);
  this_00 = ClassPtrCast<Diligent::ShaderBindingTableVkImpl,Diligent::IShaderBindingTable>(pSBT);
  RayGenShaderRecord.Stride = 0;
  RayGenShaderRecord._20_4_ = 0;
  MissShaderTable.Stride = 0;
  MissShaderTable._20_4_ = 0;
  RayGenShaderRecord.pData._0_4_ = 0;
  RayGenShaderRecord.pData._4_4_ = 0;
  RayGenShaderRecord.Size = 0;
  HitGroupTable.Stride = 0;
  HitGroupTable._20_4_ = 0;
  MissShaderTable.pData._0_4_ = 0;
  MissShaderTable.pData._4_4_ = 0;
  MissShaderTable.Size = 0;
  CallableShaderTable.Stride = 0;
  CallableShaderTable._20_4_ = 0;
  HitGroupTable.pData._0_4_ = 0;
  HitGroupTable.pData._4_4_ = 0;
  HitGroupTable.Size = 0;
  OpName = (char *)0x0;
  CallableShaderTable.pData._0_4_ = 0;
  CallableShaderTable.pData._4_4_ = 0;
  CallableShaderTable.Size = 0;
  ShaderBindingTableVkImpl::GetData
            (this_00,(BufferVkImpl **)&RayGenShaderRecord.Stride,
             (BindingTable *)&MissShaderTable.Stride,(BindingTable *)&HitGroupTable.Stride,
             (BindingTable *)&CallableShaderTable.Stride,(BindingTable *)&OpName);
  msg.field_2._8_8_ = anon_var_dwarf_4ab665;
  if ((((MissShaderTable._16_8_ == 0) && (HitGroupTable._16_8_ == 0)) &&
      (CallableShaderTable._16_8_ == 0)) && (OpName == (char *)0x0)) {
    bVar1 = BufferBase<Diligent::EngineVkImplTraits>::CheckState
                      ((BufferBase<Diligent::EngineVkImplTraits> *)RayGenShaderRecord._16_8_,
                       RESOURCE_STATE_RAY_TRACING);
    if (!bVar1) {
      FormatString<char[62]>
                ((string *)local_b8,
                 (char (*) [62])"SBT buffer must always be in RESOURCE_STATE_RAY_TRACING state");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"UpdateSBT",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xf7d);
      std::__cxx11::string::~string((string *)local_b8);
    }
  }
  else {
    TransitionOrVerifyBufferState
              (this,(BufferVkImpl *)RayGenShaderRecord._16_8_,
               RESOURCE_STATE_TRANSITION_MODE_TRANSITION,RESOURCE_STATE_COPY_DEST,
               VK_ACCESS_TRANSFER_WRITE_BIT,
               "Update shader binding table (DeviceContextVkImpl::UpdateSBT)");
    if (MissShaderTable._16_8_ != 0) {
      UpdateBuffer(this,(IBuffer *)RayGenShaderRecord._16_8_,(ulong)RayGenShaderRecord.pData._4_4_,
                   (ulong)(uint)RayGenShaderRecord.pData,(void *)MissShaderTable._16_8_,
                   RESOURCE_STATE_TRANSITION_MODE_VERIFY);
    }
    if (HitGroupTable._16_8_ != 0) {
      UpdateBuffer(this,(IBuffer *)RayGenShaderRecord._16_8_,(ulong)MissShaderTable.pData._4_4_,
                   (ulong)(uint)MissShaderTable.pData,(void *)HitGroupTable._16_8_,
                   RESOURCE_STATE_TRANSITION_MODE_VERIFY);
    }
    if (CallableShaderTable._16_8_ != 0) {
      UpdateBuffer(this,(IBuffer *)RayGenShaderRecord._16_8_,(ulong)HitGroupTable.pData._4_4_,
                   (ulong)(uint)HitGroupTable.pData,(void *)CallableShaderTable._16_8_,
                   RESOURCE_STATE_TRANSITION_MODE_VERIFY);
    }
    if (OpName != (char *)0x0) {
      UpdateBuffer(this,(IBuffer *)RayGenShaderRecord._16_8_,(ulong)CallableShaderTable.pData._4_4_,
                   (ulong)(uint)CallableShaderTable.pData,OpName,
                   RESOURCE_STATE_TRANSITION_MODE_VERIFY);
    }
    TransitionOrVerifyBufferState
              (this,(BufferVkImpl *)RayGenShaderRecord._16_8_,
               RESOURCE_STATE_TRANSITION_MODE_TRANSITION,RESOURCE_STATE_RAY_TRACING,
               VK_ACCESS_SHADER_READ_BIT,(char *)msg.field_2._8_8_);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateSBT(IShaderBindingTable* pSBT, const UpdateIndirectRTBufferAttribs* pUpdateIndirectBufferAttribs)
{
    TDeviceContextBase::UpdateSBT(pSBT, pUpdateIndirectBufferAttribs, 0);

    ShaderBindingTableVkImpl* pSBTVk       = ClassPtrCast<ShaderBindingTableVkImpl>(pSBT);
    BufferVkImpl*             pSBTBufferVk = nullptr;

    ShaderBindingTableVkImpl::BindingTable RayGenShaderRecord  = {};
    ShaderBindingTableVkImpl::BindingTable MissShaderTable     = {};
    ShaderBindingTableVkImpl::BindingTable HitGroupTable       = {};
    ShaderBindingTableVkImpl::BindingTable CallableShaderTable = {};

    pSBTVk->GetData(pSBTBufferVk, RayGenShaderRecord, MissShaderTable, HitGroupTable, CallableShaderTable);

    const char* OpName = "Update shader binding table (DeviceContextVkImpl::UpdateSBT)";

    if (RayGenShaderRecord.pData || MissShaderTable.pData || HitGroupTable.pData || CallableShaderTable.pData)
    {
        TransitionOrVerifyBufferState(*pSBTBufferVk, RESOURCE_STATE_TRANSITION_MODE_TRANSITION, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, OpName);

        // Buffer ranges do not intersect, so we don't need to add barriers between them
        if (RayGenShaderRecord.pData)
            UpdateBuffer(pSBTBufferVk, RayGenShaderRecord.Offset, RayGenShaderRecord.Size, RayGenShaderRecord.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (MissShaderTable.pData)
            UpdateBuffer(pSBTBufferVk, MissShaderTable.Offset, MissShaderTable.Size, MissShaderTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (HitGroupTable.pData)
            UpdateBuffer(pSBTBufferVk, HitGroupTable.Offset, HitGroupTable.Size, HitGroupTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        if (CallableShaderTable.pData)
            UpdateBuffer(pSBTBufferVk, CallableShaderTable.Offset, CallableShaderTable.Size, CallableShaderTable.pData, RESOURCE_STATE_TRANSITION_MODE_VERIFY);

        TransitionOrVerifyBufferState(*pSBTBufferVk, RESOURCE_STATE_TRANSITION_MODE_TRANSITION, RESOURCE_STATE_RAY_TRACING, VK_ACCESS_SHADER_READ_BIT, OpName);
    }
    else
    {
        // Ray tracing command can be used in parallel with the same SBT, so internal buffer state must be RESOURCE_STATE_RAY_TRACING to allow it.
        VERIFY(pSBTBufferVk->CheckState(RESOURCE_STATE_RAY_TRACING), "SBT buffer must always be in RESOURCE_STATE_RAY_TRACING state");
    }
}